

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

error<idx2::err_code> idx2::WriteVolume(FILE *Fp,volume *Vol,grid *Grid)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  bool bVar4;
  error<idx2::err_code> eVar5;
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> EndIt;
  grid_iterator<double> local_a0;
  grid_iterator<double> local_68;
  
  switch(Vol->Type) {
  case int8:
    End<signed_char>((grid_iterator<signed_char> *)&local_68,Grid,Vol);
    Begin<signed_char>((grid_iterator<signed_char> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (bVar4) break;
    sVar1 = fwrite(local_a0.Ptr,1,1,(FILE *)Fp);
    if (sVar1 == 1) {
      uVar3 = 0;
      do {
        local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X;
        local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X + (long)local_a0.Ptr);
        if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
          local_a0.P.field_0.field_0.X = 0;
          local_a0.P.field_0.field_0.Y = local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_a0.N.field_0.field_0.X;
          local_a0.Ptr = (double *)
                         ((long)local_a0.Ptr +
                         (local_a0.S.field_0.field_0.Y * lVar2 - (long)local_a0.D.field_0.field_0.X)
                         );
          if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
            local_a0.P.field_0.field_0.Y = 0;
            local_a0.P.field_0.field_0.Z =
                 local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           ((long)local_a0.N.field_0.field_0.Y *
                            local_a0.S.field_0.field_0.Z * lVar2 -
                           local_a0.D.field_0.field_0.Y * lVar2));
          }
        }
        bVar4 = local_a0.Ptr == local_68.Ptr;
        if (bVar4) goto LAB_0019dbf8;
        sVar1 = fwrite(local_a0.Ptr,1,1,(FILE *)Fp);
      } while (sVar1 == 1);
    }
LAB_0019dbbd:
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x58;
    uVar3 = 0xc;
    goto LAB_0019dbf8;
  case uint8:
    End<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,Grid,Vol);
    Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,1,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X + (long)local_a0.Ptr);
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           (local_a0.S.field_0.field_0.Y * lVar2 -
                           (long)local_a0.D.field_0.field_0.X));
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = (double *)
                             ((long)local_a0.Ptr +
                             ((long)local_a0.N.field_0.field_0.Y *
                              local_a0.S.field_0.field_0.Z * lVar2 -
                             local_a0.D.field_0.field_0.Y * lVar2));
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,1,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case int16:
    End<short>((grid_iterator<short> *)&local_68,Grid,Vol);
    Begin<short>((grid_iterator<short> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,2,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X * 2 + (long)local_a0.Ptr);
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           local_a0.S.field_0.field_0.Y * lVar2 * 2 +
                           (long)local_a0.D.field_0.field_0.X * -2);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = (double *)
                             ((long)local_a0.Ptr +
                             (long)local_a0.N.field_0.field_0.Y *
                             local_a0.S.field_0.field_0.Z * lVar2 * 2 +
                             local_a0.D.field_0.field_0.Y * lVar2 * -2);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,2,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case uint16:
    End<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,Grid,Vol);
    Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,2,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X * 2 + (long)local_a0.Ptr);
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           local_a0.S.field_0.field_0.Y * lVar2 * 2 +
                           (long)local_a0.D.field_0.field_0.X * -2);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = (double *)
                             ((long)local_a0.Ptr +
                             (long)local_a0.N.field_0.field_0.Y *
                             local_a0.S.field_0.field_0.Z * lVar2 * 2 +
                             local_a0.D.field_0.field_0.Y * lVar2 * -2);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,2,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case int32:
    End<int>((grid_iterator<int> *)&local_68,Grid,Vol);
    Begin<int>((grid_iterator<int> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,4,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X * 4 + (long)local_a0.Ptr);
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           local_a0.S.field_0.field_0.Y * lVar2 * 4 +
                           (long)local_a0.D.field_0.field_0.X * -4);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = (double *)
                             ((long)local_a0.Ptr +
                             (long)local_a0.N.field_0.field_0.Y *
                             local_a0.S.field_0.field_0.Z * lVar2 * 4 +
                             local_a0.D.field_0.field_0.Y * lVar2 * -4);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,4,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case uint32:
    End<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,Grid,Vol);
    Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,4,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X * 4 + (long)local_a0.Ptr);
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           local_a0.S.field_0.field_0.Y * lVar2 * 4 +
                           (long)local_a0.D.field_0.field_0.X * -4);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = (double *)
                             ((long)local_a0.Ptr +
                             (long)local_a0.N.field_0.field_0.Y *
                             local_a0.S.field_0.field_0.Z * lVar2 * 4 +
                             local_a0.D.field_0.field_0.Y * lVar2 * -4);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,4,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case int64:
    End<long>((grid_iterator<long> *)&local_68,Grid,Vol);
    Begin<long>((grid_iterator<long> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,8,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = local_a0.Ptr + local_a0.S.field_0.field_0.X;
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = local_a0.Ptr +
                           (local_a0.S.field_0.field_0.Y * lVar2 -
                           (long)local_a0.D.field_0.field_0.X);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = local_a0.Ptr +
                             ((long)local_a0.N.field_0.field_0.Y *
                              local_a0.S.field_0.field_0.Z * lVar2 -
                             local_a0.D.field_0.field_0.Y * lVar2);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,8,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case uint64:
    End<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,Grid,Vol);
    Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,8,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = local_a0.Ptr + local_a0.S.field_0.field_0.X;
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = local_a0.Ptr +
                           (local_a0.S.field_0.field_0.Y * lVar2 -
                           (long)local_a0.D.field_0.field_0.X);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = local_a0.Ptr +
                             ((long)local_a0.N.field_0.field_0.Y *
                              local_a0.S.field_0.field_0.Z * lVar2 -
                             local_a0.D.field_0.field_0.Y * lVar2);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,8,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case float32:
    End<float>((grid_iterator<float> *)&local_68,Grid,Vol);
    Begin<float>((grid_iterator<float> *)&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,4,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = (double *)((long)local_a0.S.field_0.field_0.X * 4 + (long)local_a0.Ptr);
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = (double *)
                           ((long)local_a0.Ptr +
                           local_a0.S.field_0.field_0.Y * lVar2 * 4 +
                           (long)local_a0.D.field_0.field_0.X * -4);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = (double *)
                             ((long)local_a0.Ptr +
                             (long)local_a0.N.field_0.field_0.Y *
                             local_a0.S.field_0.field_0.Z * lVar2 * 4 +
                             local_a0.D.field_0.field_0.Y * lVar2 * -4);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,4,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  case float64:
    End<double>(&local_68,Grid,Vol);
    Begin<double>(&local_a0,Grid,Vol);
    bVar4 = local_a0.Ptr == local_68.Ptr;
    if (!bVar4) {
      sVar1 = fwrite(local_a0.Ptr,8,1,(FILE *)Fp);
      if (sVar1 == 1) {
        uVar3 = 0;
        do {
          local_a0.P.field_0.field_0.X = local_a0.P.field_0.field_0.X + local_a0.S.field_0.field_0.X
          ;
          local_a0.Ptr = local_a0.Ptr + local_a0.S.field_0.field_0.X;
          if (local_a0.D.field_0.field_0.X <= local_a0.P.field_0.field_0.X) {
            local_a0.P.field_0.field_0.X = 0;
            local_a0.P.field_0.field_0.Y =
                 local_a0.P.field_0.field_0.Y + local_a0.S.field_0.field_0.Y;
            lVar2 = (long)local_a0.N.field_0.field_0.X;
            local_a0.Ptr = local_a0.Ptr +
                           (local_a0.S.field_0.field_0.Y * lVar2 -
                           (long)local_a0.D.field_0.field_0.X);
            if (local_a0.D.field_0.field_0.Y <= local_a0.P.field_0.field_0.Y) {
              local_a0.P.field_0.field_0.Y = 0;
              local_a0.P.field_0.field_0.Z =
                   local_a0.P.field_0.field_0.Z + local_a0.S.field_0.field_0.Z;
              local_a0.Ptr = local_a0.Ptr +
                             ((long)local_a0.N.field_0.field_0.Y *
                              local_a0.S.field_0.field_0.Z * lVar2 -
                             local_a0.D.field_0.field_0.Y * lVar2);
            }
          }
          bVar4 = local_a0.Ptr == local_68.Ptr;
          if (bVar4) goto LAB_0019dbf8;
          sVar1 = fwrite(local_a0.Ptr,8,1,(FILE *)Fp);
        } while (sVar1 == 1);
      }
      goto LAB_0019dbbd;
    }
    break;
  default:
    goto switchD_0019d0c4_default;
  }
  uVar3 = 0;
LAB_0019dbf8:
  if (bVar4) {
switchD_0019d0c4_default:
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x58;
    uVar3 = 0;
  }
  eVar5.Code = (int)uVar3;
  eVar5.StackIdx = (char)((ulong)uVar3 >> 0x20);
  eVar5.StrGened = (bool)(char)((ulong)uVar3 >> 0x28);
  eVar5._14_2_ = (short)((ulong)uVar3 >> 0x30);
  eVar5.Msg = "";
  return eVar5;
}

Assistant:

error<>
WriteVolume(FILE* Fp, const volume& Vol, const grid& Grid)
{
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Grid, Vol);                                                               \
  for (auto It = Begin<type>(Grid, Vol); It != EndIt; ++It)                                        \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}